

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaDedicatedAllocationList::AddStatistics
          (VmaDedicatedAllocationList *this,VmaStatistics *inoutStats)

{
  undefined4 uVar1;
  undefined4 uVar3;
  VkDeviceSize VVar2;
  int iVar4;
  ItemType *pIVar5;
  DedicatedAllocationLinkedList *pDVar6;
  VkDeviceSize VVar7;
  VkDeviceSize VVar8;
  undefined1 auVar9 [16];
  VmaMutexLockRead lock;
  VmaMutexLockRead local_18;
  
  local_18.m_pMutex = (VmaRWMutex *)0x0;
  if (this->m_UseMutex != false) {
    local_18.m_pMutex = &this->m_Mutex;
  }
  if (this->m_UseMutex == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&this->m_Mutex);
  }
  uVar1 = inoutStats->blockCount;
  uVar3 = inoutStats->allocationCount;
  iVar4 = (int)(this->m_AllocationList).m_Count;
  inoutStats->blockCount = iVar4 + uVar1;
  inoutStats->allocationCount = iVar4 + uVar3;
  VVar7 = inoutStats->blockBytes;
  VVar8 = inoutStats->allocationBytes;
  pDVar6 = &this->m_AllocationList;
  while (pIVar5 = pDVar6->m_Front, pIVar5 != (ItemType *)0x0) {
    VVar2 = pIVar5->m_Size;
    auVar9._8_4_ = (int)VVar2;
    auVar9._0_8_ = VVar2;
    auVar9._12_4_ = (int)(VVar2 >> 0x20);
    VVar7 = VVar7 + VVar2;
    VVar8 = VVar8 + auVar9._8_8_;
    inoutStats->blockBytes = VVar7;
    inoutStats->allocationBytes = VVar8;
    pDVar6 = (DedicatedAllocationLinkedList *)((long)&pIVar5->field_0 + 0x20);
  }
  VmaMutexLockRead::~VmaMutexLockRead(&local_18);
  return;
}

Assistant:

void VmaDedicatedAllocationList::AddStatistics(VmaStatistics& inoutStats)
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);

    const uint32_t allocCount = (uint32_t)m_AllocationList.GetCount();
    inoutStats.blockCount += allocCount;
    inoutStats.allocationCount += allocCount;

    for(auto* item = m_AllocationList.Front(); item != nullptr; item = DedicatedAllocationLinkedList::GetNext(item))
    {
        const VkDeviceSize size = item->GetSize();
        inoutStats.blockBytes += size;
        inoutStats.allocationBytes += size;
    }
}